

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

longlong get_big_int(FMFieldPtr field,void *data)

{
  ushort uVar1;
  FMdata_type FVar2;
  ushort uVar3;
  unsigned_long_long uVar4;
  size_t sVar5;
  ulong uVar6;
  int i;
  void *in_RDX;
  long lVar7;
  undefined1 uVar8;
  undefined7 uVar9;
  bool bVar10;
  longdouble in_ST0;
  long tmp;
  longlong local_18 [2];
  
  uVar8 = SUB81(data,0);
  uVar9 = (undefined7)((ulong)data >> 8);
  FVar2 = field->data_type;
  if (FVar2 == float_type) {
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    local_18[0] = (longlong)in_ST0;
  }
  else {
    if (FVar2 == unsigned_type) {
      uVar4 = get_big_unsigned(field,data);
      return uVar4;
    }
    if (FVar2 != integer_type) {
      get_big_int_cold_2();
      uVar4 = get_big_unsigned(field,(void *)CONCAT71(uVar9,uVar8));
      return uVar4;
    }
    switch(field->size) {
    case 1:
      local_18[0] = (longlong)*(char *)((long)data + field->offset);
      break;
    case 2:
      uVar1 = *(ushort *)((long)data + field->offset);
      uVar3 = uVar1 >> 8;
      if (field->byte_swap == '\0') {
        uVar3 = uVar1;
        uVar1 = uVar1 >> 8;
      }
      local_18[0] = (longlong)(short)(uVar3 & 0xff | uVar1 << 8);
      break;
    case 4:
      local_18[0] = CONCAT44(local_18[0]._4_4_,*(undefined4 *)((long)data + field->offset));
      if (field->byte_swap != '\0') {
        uVar6 = 0x300000000;
        lVar7 = 0;
        do {
          uVar8 = *(undefined1 *)((long)local_18 + lVar7);
          *(undefined1 *)((long)local_18 + lVar7) =
               *(undefined1 *)((long)local_18 + (uVar6 >> 0x20));
          *(undefined1 *)((long)local_18 + (uVar6 >> 0x20)) = uVar8;
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 - 0x100000000;
        } while (lVar7 != 2);
      }
      local_18[0] = (longlong)(int)local_18[0];
      break;
    case 8:
      local_18[0] = *(longlong *)((long)data + field->offset);
      if (field->byte_swap != '\0') {
        uVar6 = 0x700000000;
        lVar7 = 0;
        do {
          uVar8 = *(undefined1 *)((long)local_18 + lVar7);
          *(undefined1 *)((long)local_18 + lVar7) =
               *(undefined1 *)((long)local_18 + (uVar6 >> 0x20));
          *(undefined1 *)((long)local_18 + (uVar6 >> 0x20)) = uVar8;
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 - 0x100000000;
        } while (lVar7 != 4);
      }
      break;
    default:
      if (field->size == 0x10) {
        bVar10 = field->byte_swap == '\0';
        sVar5 = field->offset + 8;
        if (bVar10) {
          sVar5 = field->offset;
        }
        local_18[0] = *(longlong *)((long)data + sVar5);
        if (bVar10) {
          return *(longlong *)((long)data + sVar5);
        }
        uVar6 = 0x700000000;
        lVar7 = 0;
        do {
          uVar8 = *(undefined1 *)((long)local_18 + lVar7);
          *(undefined1 *)((long)local_18 + lVar7) =
               *(undefined1 *)((long)local_18 + (uVar6 >> 0x20));
          *(undefined1 *)((long)local_18 + (uVar6 >> 0x20)) = uVar8;
          lVar7 = lVar7 + 1;
          uVar6 = uVar6 - 0x100000000;
        } while (lVar7 != 4);
        return local_18[0];
      }
    case 3:
    case 5:
    case 6:
    case 7:
      local_18[0] = -1;
      if (get_long_warn == 0) {
        get_big_int_cold_1();
      }
    }
  }
  return local_18[0];
}

Assistant:

static MAX_INTEGER_TYPE
get_big_int(FMFieldPtr field, void *data)
{
    if (field->data_type == integer_type) {
	if (field->size == sizeof(char)) {
	    char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (long) tmp;
	} else if (field->size == sizeof(short)) {
	    short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(short));
	    return (long) tmp;
	} else if (field->size == sizeof(int)) {
	    int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(int));
	    return (long) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return -1;
	}
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_INTEGER_TYPE) (long) (double) tmp;
#else
	return (MAX_INTEGER_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOlong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}